

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_thread.cpp
# Opt level: O0

void __thiscall DrawerCommandQueue::Finish(DrawerCommandQueue *this)

{
  long lVar1;
  bool bVar2;
  _func_void_void_ptr *tryBlock;
  _func_void_void_ptr_char_ptr_bool *catchBlock;
  char *pcVar3;
  reference ppDVar4;
  DrawerCommand **command;
  iterator __end1;
  iterator __begin1;
  vector<DrawerCommand_*,_std::allocator<DrawerCommand_*>_> *__range1;
  undefined1 auStack_1cdd0 [8];
  unique_lock<std::mutex> end_lock;
  undefined8 uStack_1cdb8;
  TryCatchData data;
  DrawerThread thread;
  undefined1 local_28 [8];
  unique_lock<std::mutex> start_lock;
  DrawerCommandQueue *queue;
  DrawerCommandQueue *this_local;
  
  start_lock._8_8_ = Instance();
  bVar2 = std::vector<DrawerCommand_*,_std::allocator<DrawerCommand_*>_>::empty
                    (&((DrawerCommandQueue *)start_lock._8_8_)->commands);
  if (!bVar2) {
    std::unique_lock<std::mutex>::unique_lock
              ((unique_lock<std::mutex> *)local_28,
               (mutex_type *)(Instance::queue.memorypool + start_lock._8_8_ + 0x599548));
    std::vector<DrawerCommand_*,_std::allocator<DrawerCommand_*>_>::swap
              ((vector<DrawerCommand_*,_std::allocator<DrawerCommand_*>_> *)
               (Instance::queue.memorypool + start_lock._8_8_ + 0x5995a0),
               (vector<DrawerCommand_*,_std::allocator<DrawerCommand_*>_> *)
               (Instance::queue.memorypool + start_lock._8_8_ + 0x599518));
    *(int *)(Instance::queue.memorypool + start_lock._8_8_ + 0x5995bc) =
         *(int *)(Instance::queue.memorypool + start_lock._8_8_ + 0x5995bc) + 1;
    std::unique_lock<std::mutex>::unlock((unique_lock<std::mutex> *)local_28);
    StartThreads((DrawerCommandQueue *)start_lock._8_8_);
    std::condition_variable::notify_all();
    DrawerThread::DrawerThread((DrawerThread *)&data.command_index);
    std::vector<DrawerThread,_std::allocator<DrawerThread>_>::size
              ((vector<DrawerThread,_std::allocator<DrawerThread>_> *)
               (Instance::queue.memorypool + start_lock._8_8_ + 0x599530));
    uStack_1cdb8._0_1_ = start_lock._M_owns;
    uStack_1cdb8._1_7_ = start_lock._9_7_;
    data.queue = (DrawerCommandQueue *)&data.command_index;
    data.thread = (DrawerThread *)0x0;
    tryBlock = Finish()::$_0::operator_cast_to_function_pointer((__0 *)&end_lock.field_0xf);
    catchBlock = Finish()::$_1::operator_cast_to_function_pointer((__1 *)&end_lock.field_0xe);
    VectoredTryCatch(&uStack_1cdb8,tryBlock,catchBlock);
    std::unique_lock<std::mutex>::unique_lock
              ((unique_lock<std::mutex> *)auStack_1cdd0,
               (mutex_type *)(Instance::queue.memorypool + start_lock._8_8_ + 0x5995c0));
    std::condition_variable::wait<DrawerCommandQueue::Finish()::__2>
              ((condition_variable *)(Instance::queue.memorypool + start_lock._8_8_ + 0x5995e8),
               (unique_lock<std::mutex> *)auStack_1cdd0,(anon_class_8_1_a8890831)&start_lock._M_owns
              );
    bVar2 = FString::IsEmpty((FString *)
                             (Instance::queue.memorypool +
                             (long)(TArray<SRailHit,_SRailHit>::TArray + start_lock._8_8_)));
    if (!bVar2) {
      if ((Instance::queue.memorypool[start_lock._8_8_ + 0x599628] & 1U) == 0) {
        if ((Finish::first & 1U) != 0) {
          pcVar3 = FString::GetChars((FString *)
                                     (Instance::queue.memorypool +
                                     (long)(TArray<SRailHit,_SRailHit>::TArray + start_lock._8_8_)))
          ;
          Printf("%s\n",pcVar3);
        }
      }
      else {
        pcVar3 = FString::GetChars((FString *)
                                   (Instance::queue.memorypool +
                                   (long)(TArray<SRailHit,_SRailHit>::TArray + start_lock._8_8_)));
        I_FatalError("%s",pcVar3);
      }
      Finish::first = false;
    }
    lVar1 = start_lock._8_8_ + 0x5995a0;
    __end1 = std::vector<DrawerCommand_*,_std::allocator<DrawerCommand_*>_>::begin
                       ((vector<DrawerCommand_*,_std::allocator<DrawerCommand_*>_> *)
                        (Instance::queue.memorypool + lVar1));
    command = (DrawerCommand **)
              std::vector<DrawerCommand_*,_std::allocator<DrawerCommand_*>_>::end
                        ((vector<DrawerCommand_*,_std::allocator<DrawerCommand_*>_> *)
                         (Instance::queue.memorypool + lVar1));
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<DrawerCommand_**,_std::vector<DrawerCommand_*,_std::allocator<DrawerCommand_*>_>_>
                                       *)&command), bVar2) {
      ppDVar4 = __gnu_cxx::
                __normal_iterator<DrawerCommand_**,_std::vector<DrawerCommand_*,_std::allocator<DrawerCommand_*>_>_>
                ::operator*(&__end1);
      (**(*ppDVar4)->_vptr_DrawerCommand)();
      __gnu_cxx::
      __normal_iterator<DrawerCommand_**,_std::vector<DrawerCommand_*,_std::allocator<DrawerCommand_*>_>_>
      ::operator++(&__end1);
    }
    std::vector<DrawerCommand_*,_std::allocator<DrawerCommand_*>_>::clear
              ((vector<DrawerCommand_*,_std::allocator<DrawerCommand_*>_> *)
               (Instance::queue.memorypool + start_lock._8_8_ + 0x5995a0));
    *(undefined8 *)(start_lock._8_8_ + 0x1000000) = 0;
    pcVar3 = Instance::queue.memorypool + start_lock._8_8_ + 0x599618;
    pcVar3[0] = '\0';
    pcVar3[1] = '\0';
    pcVar3[2] = '\0';
    pcVar3[3] = '\0';
    pcVar3[4] = '\0';
    pcVar3[5] = '\0';
    pcVar3[6] = '\0';
    pcVar3[7] = '\0';
    std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)auStack_1cdd0);
    DrawerThread::~DrawerThread((DrawerThread *)&data.command_index);
    std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_28);
  }
  return;
}

Assistant:

void DrawerCommandQueue::Finish()
{
	auto queue = Instance();
	if (queue->commands.empty())
		return;

	// Give worker threads something to do:

	std::unique_lock<std::mutex> start_lock(queue->start_mutex);
	queue->active_commands.swap(queue->commands);
	queue->run_id++;
	start_lock.unlock();

	queue->StartThreads();
	queue->start_condition.notify_all();

	// Do one thread ourselves:

	DrawerThread thread;
	thread.core = 0;
	thread.num_cores = (int)(queue->threads.size() + 1);

	struct TryCatchData
	{
		DrawerCommandQueue *queue;
		DrawerThread *thread;
		size_t command_index;
	} data;

	data.queue = queue;
	data.thread = &thread;
	data.command_index = 0;
	VectoredTryCatch(&data,
	[](void *data)
	{
		TryCatchData *d = (TryCatchData*)data;

		for (int pass = 0; pass < d->queue->num_passes; pass++)
		{
			d->thread->pass_start_y = pass * d->queue->rows_in_pass;
			d->thread->pass_end_y = (pass + 1) * d->queue->rows_in_pass;
			if (pass + 1 == d->queue->num_passes)
				d->thread->pass_end_y = MAX(d->thread->pass_end_y, MAXHEIGHT);

			size_t size = d->queue->active_commands.size();
			for (d->command_index = 0; d->command_index < size; d->command_index++)
			{
				auto &command = d->queue->active_commands[d->command_index];
				command->Execute(d->thread);
			}
		}
	},
	[](void *data, const char *reason, bool fatal)
	{
		TryCatchData *d = (TryCatchData*)data;
		ReportDrawerError(d->queue->active_commands[d->command_index], true, reason, fatal);
	});

	// Wait for everyone to finish:

	std::unique_lock<std::mutex> end_lock(queue->end_mutex);
	queue->end_condition.wait(end_lock, [&]() { return queue->finished_threads == queue->threads.size(); });

	if (!queue->thread_error.IsEmpty())
	{
		static bool first = true;
		if (queue->thread_error_fatal)
			I_FatalError("%s", queue->thread_error.GetChars());
		else if (first)
			Printf("%s\n", queue->thread_error.GetChars());
		first = false;
	}

	// Clean up batch:

	for (auto &command : queue->active_commands)
		command->~DrawerCommand();
	queue->active_commands.clear();
	queue->memorypool_pos = 0;
	queue->finished_threads = 0;
}